

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

hugeint_t duckdb::CastInterpolation::Cast<duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t *src,Vector *result)

{
  duckdb *this;
  uint64_t uVar1;
  bool bVar2;
  InvalidInputException *this_00;
  int64_t iVar3;
  hugeint_t input;
  hugeint_t result_1;
  hugeint_t local_50;
  string local_40;
  
  this = (duckdb *)src->lower;
  uVar1 = src->upper;
  iVar3 = 0;
  bVar2 = TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(*src,&local_50,false);
  if (bVar2) {
    return local_50;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input.upper = iVar3;
  input.lower = uVar1;
  CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_40,this,input);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TARGET_TYPE Cast(const INPUT_TYPE &src, Vector &result) {
		return Cast::Operation<INPUT_TYPE, TARGET_TYPE>(src);
	}